

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O3

Value * __thiscall flow::IRBuilder::createN2S(IRBuilder *this,Value *rhs,string *name)

{
  long lVar1;
  size_t sVar2;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *pCVar3;
  char buf [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Value *local_70;
  string local_68 [2];
  
  local_70 = rhs;
  if (rhs->type_ != Number) {
    __assert_fail("rhs->type() == LiteralType::Number",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x246,"Value *flow::IRBuilder::createN2S(Value *, const std::string &)");
  }
  lVar1 = __dynamic_cast(rhs,&Value::typeinfo,&ConstantValue<long,(flow::LiteralType)2>::typeinfo,0)
  ;
  if (lVar1 == 0) {
    local_90._M_dataplus._M_p._0_4_ = 3;
    makeName(local_68,this,name);
    pCVar3 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
              *)insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
                          (this,(LiteralType *)&local_90,&local_70,local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68[0]._M_dataplus._M_p == &local_68[0].field_2) {
      return (Value *)pCVar3;
    }
  }
  else {
    snprintf((char *)local_68,0x40,"%li",*(undefined8 *)(lVar1 + 0x48));
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    sVar2 = strlen((char *)local_68);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,local_68,(long)&local_68[0]._M_dataplus._M_p + sVar2);
    pCVar3 = IRProgram::
             get<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::__cxx11::string>
                       (this->program_,&this->program_->strings_,&local_90);
    local_68[0].field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
    local_68[0]._M_dataplus._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return (Value *)pCVar3;
    }
  }
  operator_delete(local_68[0]._M_dataplus._M_p,local_68[0].field_2._0_8_ + 1);
  return (Value *)pCVar3;
}

Assistant:

Value* IRBuilder::createN2S(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Number);

  if (auto i = dynamic_cast<ConstantInt*>(rhs)) {
    char buf[64];
    snprintf(buf, sizeof(buf), "%" PRIi64 "", i->get());
    return get(buf);
  }

  return insert<CastInstr>(LiteralType::String, rhs, makeName(name));
}